

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_tuple_primitive_basicAllocateWithTypeInstanceSizeAlignmentSlotCountIsBytesIsWeak
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_header_t *header;
  ulong uVar2;
  sysbvm_object_tuple_t *psVar3;
  ulong uVar4;
  
  if (argumentCount != 7) {
    sysbvm_error_argumentCountMismatch(7,argumentCount);
  }
  uVar2 = arguments[4] >> 4;
  if ((arguments[4] & 0xf) == 0) {
    uVar2 = 0;
  }
  sVar1 = arguments[6];
  if (arguments[5] == 0x1f) {
    uVar4 = arguments[1] >> 4;
    if ((arguments[1] & 0xf) == 0) {
      uVar4 = 0;
    }
    psVar3 = sysbvm_context_allocateByteTuple(context,*arguments,uVar4 + uVar2);
  }
  else {
    uVar4 = arguments[3] >> 4;
    if ((arguments[3] & 0xf) == 0) {
      uVar4 = 0;
    }
    psVar3 = sysbvm_context_allocatePointerTuple(context,*arguments,uVar4 + uVar2);
  }
  if ((sVar1 == 0x1f) && (((ulong)psVar3 & 0xf) == 0 && psVar3 != (sysbvm_object_tuple_t *)0x0)) {
    (psVar3->header).identityHashAndFlags =
         (psVar3->header).identityHashAndFlags & 0xfffffcff | 0x100;
  }
  return (sysbvm_tuple_t)psVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_basicAllocateWithTypeInstanceSizeAlignmentSlotCountIsBytesIsWeak(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 7) sysbvm_error_argumentCountMismatch(7, argumentCount);

    sysbvm_tuple_t *type = arguments + 0;
    size_t instanceSize = sysbvm_tuple_anySize_decode(arguments[1]);
    //sysbvm_tuple_t *instanceAlignment = arguments + 2;
    size_t slotCount = sysbvm_tuple_anySize_decode(arguments[3]);
    size_t variableSize = sysbvm_tuple_anySize_decode(arguments[4]);
    bool isBytes = sysbvm_tuple_boolean_decode(arguments[5]);
    bool isWeak = sysbvm_tuple_boolean_decode(arguments[6]);

    sysbvm_tuple_t result = isBytes
        ? (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, *type, instanceSize + variableSize)
        : (sysbvm_tuple_t)sysbvm_context_allocatePointerTuple(context, *type, slotCount + variableSize);

    if(isWeak)
        sysbvm_tuple_markWeakObject(result);
    
    return result;
}